

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colour_filters.cpp
# Opt level: O2

Mat * filter_arrow(Mat *img,array<cv::Mat,_5UL> *target_filled,bool debug)

{
  undefined1 *puVar1;
  _InputArray *p_Var2;
  char in_CL;
  undefined7 in_register_00000011;
  long lVar3;
  int in_R8D;
  undefined8 local_768;
  undefined8 local_760;
  _InputArray local_758 [4];
  _InputArray local_6f8 [4];
  Matx<double,_4,_1> local_698 [11];
  _InputArray local_538;
  undefined8 uStack_520;
  _InputArray local_3d0 [14];
  Scalar_<double> local_270;
  Scalar_<double> local_250;
  _OutputArray local_230 [4];
  array<cv::Mat,_4UL> colours;
  Mat local_50 [32];
  
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_50,255.0);
  filter_yellow((Mat *)local_6f8);
  cv::operator-((Scalar_ *)&local_538,local_50);
  cv::MatExpr::operator_cast_to_Mat((MatExpr *)&colours);
  cv::Scalar_<double>::Scalar_(&local_250,255.0);
  filter_red((Mat *)local_758);
  cv::operator-((Scalar_ *)local_698,(Mat *)&local_250);
  cv::MatExpr::operator_cast_to_Mat((MatExpr *)&colours.field_0x60);
  cv::Scalar_<double>::Scalar_(&local_270,255.0);
  filter_blue((Mat *)local_230);
  cv::operator-((Scalar_ *)local_3d0,(Mat *)&local_270);
  cv::MatExpr::operator_cast_to_Mat((MatExpr *)&colours.field_0xc0);
  puVar1 = &colours.field_0x120;
  cv::Mat::clone();
  cv::MatExpr::~MatExpr((MatExpr *)local_3d0);
  cv::Mat::~Mat((Mat *)local_230);
  cv::MatExpr::~MatExpr((MatExpr *)local_698);
  cv::Mat::~Mat((Mat *)local_758);
  cv::MatExpr::~MatExpr((MatExpr *)&local_538);
  cv::Mat::~Mat((Mat *)local_6f8);
  local_538.sz.width = 0;
  local_538.sz.height = 0;
  local_698[0].val[2] = 0.0;
  local_538.flags = 0x1010000;
  local_698[0].val[0] = (double)CONCAT44(local_698[0].val[0]._4_4_,0x2010000);
  local_698[0].val[1] = (double)puVar1;
  local_538.obj = puVar1;
  cv::cvtColor((cv *)&local_538,(_InputArray *)local_698,(_OutputArray *)0x43,0,in_R8D);
  local_3d0[0].sz.width = 0;
  local_3d0[0].sz.height = 0;
  local_3d0[0].flags = 0x1010000;
  local_3d0[0].obj = puVar1;
  cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&local_538);
  local_538.sz.width = 0;
  local_538.sz.height = 0;
  uStack_520 = 0;
  local_538.flags = 0;
  local_538._4_4_ = 0;
  local_538.obj = (array<cv::Mat,_4UL> *)0x0;
  local_6f8[0].flags = -0x3efdfffa;
  local_6f8[0].sz.width = 1;
  local_6f8[0].sz.height = 4;
  local_6f8[0].obj = &local_538;
  cv::Matx<double,_4,_1>::Matx(local_698);
  local_698[0].val[0] = 255.0;
  local_698[0].val[1] = 140.0;
  local_698[0].val[2] = 80.0;
  local_698[0].val[3] = 0.0;
  local_758[0].flags = -0x3efdfffa;
  local_230[0].super__InputArray.sz.width = 0;
  local_230[0].super__InputArray.sz.height = 0;
  local_758[0].sz.width = 1;
  local_758[0].sz.height = 4;
  local_230[0].super__InputArray.flags = 0x2010000;
  local_758[0].obj = local_698;
  local_230[0].super__InputArray.obj = puVar1;
  cv::inRange(local_3d0,local_6f8,local_758,local_230);
  if (in_CL != '\0') {
    for (lVar3 = 0; lVar3 != 0x180; lVar3 = lVar3 + 0x60) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_538,"black_layer",(allocator<char> *)local_698);
      cv::namedWindow((string *)&local_538,0);
      std::__cxx11::string::~string((string *)&local_538);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_538,"black_layer",(allocator<char> *)local_3d0);
      local_698[0].val[2] = 0.0;
      local_698[0].val[1] = (double)(local_50 + lVar3 + -0x180);
      local_698[0].val[0] = (double)CONCAT44(local_698[0].val[0]._4_4_,0x1010000);
      cv::imshow((string *)&local_538,(_InputArray *)local_698);
      std::__cxx11::string::~string((string *)&local_538);
      cv::waitKey(0);
      cv::destroyAllWindows();
    }
  }
  for (lVar3 = 0; lVar3 != 0x120; lVar3 = lVar3 + 0x60) {
    local_538.obj = local_50 + lVar3 + -0x180;
    local_538.sz.width = 0;
    local_538.sz.height = 0;
    local_538.flags = 0x1010000;
    local_698[0].val[2] = 0.0;
    local_698[0].val[1] = (double)(CONCAT71(in_register_00000011,debug) + lVar3);
    local_3d0[0].sz.width = 0;
    local_3d0[0].sz.height = 0;
    local_698[0].val[0] = (double)CONCAT44(local_698[0].val[0]._4_4_,0x1010000);
    local_3d0[0].flags = 0x2010000;
    local_3d0[0].obj = local_538.obj;
    p_Var2 = (_InputArray *)cv::noArray();
    cv::bitwise_and(&local_538,(_InputArray *)local_698,(_OutputArray *)local_3d0,p_Var2);
  }
  if (in_CL != '\0') {
    for (lVar3 = 0; lVar3 != 0x180; lVar3 = lVar3 + 0x60) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_538,"cleaned black_layer",(allocator<char> *)local_698);
      cv::namedWindow((string *)&local_538,0);
      std::__cxx11::string::~string((string *)&local_538);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_538,"cleaned black_layer",(allocator<char> *)local_3d0);
      local_698[0].val[2] = 0.0;
      local_698[0].val[1] = (double)(local_50 + lVar3 + -0x180);
      local_698[0].val[0] = (double)CONCAT44(local_698[0].val[0]._4_4_,0x1010000);
      cv::imshow((string *)&local_538,(_InputArray *)local_698);
      std::__cxx11::string::~string((string *)&local_538);
      cv::waitKey(0);
      cv::destroyAllWindows();
    }
  }
  for (lVar3 = 0x60; local_3d0[0].obj = &colours, lVar3 != 0x180; lVar3 = lVar3 + 0x60) {
    local_538.sz.width = 0;
    local_538.sz.height = 0;
    local_538.flags = 0x1010000;
    local_698[0].val[2] = 0.0;
    local_698[0].val[1] = (double)(local_50 + lVar3 + -0x180);
    local_3d0[0].sz.width = 0;
    local_3d0[0].sz.height = 0;
    local_698[0].val[0] = (double)CONCAT44(local_698[0].val[0]._4_4_,0x1010000);
    local_3d0[0].flags = 0x2010000;
    local_538.obj = &colours;
    p_Var2 = (_InputArray *)cv::noArray();
    cv::bitwise_or(&local_538,(_InputArray *)local_698,(_OutputArray *)local_3d0,p_Var2);
  }
  local_3d0[0].sz.width = 0;
  local_3d0[0].sz.height = 0;
  local_6f8[0].sz.width = 0;
  local_6f8[0].sz.height = 0;
  local_3d0[0].flags = 0x1010000;
  local_6f8[0].flags = 0x2010000;
  local_6f8[0].obj = &colours;
  cv::Mat::Mat((Mat *)&local_538);
  local_758[0].sz.width = 0;
  local_758[0].sz.height = 0;
  local_758[0].flags = 0x1010000;
  local_760 = 0xffffffffffffffff;
  local_758[0].obj = &local_538;
  cv::morphologyDefaultBorderValue();
  cv::erode(local_3d0,local_6f8,local_758,&local_760,4,0,local_698);
  cv::Mat::~Mat((Mat *)&local_538);
  local_3d0[0].sz.width = 0;
  local_3d0[0].sz.height = 0;
  local_6f8[0].sz.width = 0;
  local_6f8[0].sz.height = 0;
  local_3d0[0].flags = 0x1010000;
  local_6f8[0].flags = 0x2010000;
  local_6f8[0].obj = &colours;
  local_3d0[0].obj = &colours;
  cv::Mat::Mat((Mat *)&local_538,8,8,0);
  local_758[0].sz.width = 0;
  local_758[0].sz.height = 0;
  local_758[0].flags = 0x1010000;
  local_768 = 0xffffffffffffffff;
  local_758[0].obj = &local_538;
  cv::morphologyDefaultBorderValue();
  cv::dilate(local_3d0,local_6f8,local_758,&local_768,8,0,local_698);
  cv::Mat::~Mat((Mat *)&local_538);
  cv::Mat::Mat(img,(Mat *)&colours);
  std::array<cv::Mat,_4UL>::~array(&colours);
  return img;
}

Assistant:

cv::Mat filter_arrow(const cv::Mat& img, const std::array<cv::Mat, 5>& target_filled, bool debug)
{
    std::array<cv::Mat, 4> colours {
        255 - filter_yellow(img), 255 - filter_red(img), 255 - filter_blue(img), img.clone()};
    cv::cvtColor(colours[3], colours[3], cv::COLOR_RGB2HSV_FULL);
    cv::inRange(colours[3], cv::Scalar(0, 0, 0), cv::Scalar(255, 140, 80), colours[3]);

    if(debug)
    {
        for(const auto& mat : colours)
        {
            cv::namedWindow("black_layer", cv::WINDOW_NORMAL);
            cv::imshow("black_layer", mat);
            cv::waitKey(0);
            cv::destroyAllWindows();
        }
    }
    assert(colours.size() > 3 && target_filled.size() >= colours.size());
    for(std::size_t i = 0; i < 3; i++)
    {
        cv::bitwise_and(colours[i], target_filled[i], colours[i]);
    }

    if(debug)
    {
        for(const auto& mat : colours)
        {
            cv::namedWindow("cleaned black_layer", cv::WINDOW_NORMAL);
            cv::imshow("cleaned black_layer", mat);
            cv::waitKey(0);
            cv::destroyAllWindows();
        }
    }

    for(std::size_t i = 1; i < colours.size(); i++)
    {
        cv::bitwise_or(colours[0], colours[i], colours[0]);
    }

    cv::erode(colours[0], colours[0], cv::Mat(), cv::Point(-1, -1), 4);
    cv::dilate(colours[0], colours[0], cv::Mat(8, 8, 0), cv::Point(-1, -1), 8);

    return colours[0];
}